

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedSetGet.cpp
# Opt level: O0

IterateResult __thiscall glcts::DrawBuffersIndexedSetGet::iterate(DrawBuffersIndexedSetGet *this)

{
  Context *context;
  bool bVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestLog *log;
  GLenum error_code;
  undefined1 local_50 [8];
  BlendMaskStateMachine state;
  GLint maxDrawBuffers;
  Functions *gl;
  DrawBuffersIndexedSetGet *this_local;
  
  pRVar3 = deqp::Context::getRenderContext
                     ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  state.testLog._4_4_ = 0;
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0x868))
            (0x8824,(undefined1 *)((long)&state.testLog + 4));
  if (state.testLog._4_4_ < 4) {
    tcu::TestContext::setTestResult
              ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.super_TestNode
               .m_testCtx,QP_TEST_RESULT_FAIL,"Minimum number of draw buffers too low");
  }
  else {
    context = (this->super_DrawBuffersIndexedBase).super_TestCaseBase.m_context;
    log = tcu::TestContext::getLog
                    ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.
                     super_TestNode.m_testCtx);
    DrawBuffersIndexedBase::BlendMaskStateMachine::BlendMaskStateMachine
              ((BlendMaskStateMachine *)local_50,context,log,state.testLog._4_4_);
    DrawBuffersIndexedBase::BlendMaskStateMachine::SetEnable((BlendMaskStateMachine *)local_50);
    DrawBuffersIndexedBase::BlendMaskStateMachine::SetColorMask
              ((BlendMaskStateMachine *)local_50,'\0','\0','\0','\0');
    DrawBuffersIndexedBase::BlendMaskStateMachine::SetBlendEquation
              ((BlendMaskStateMachine *)local_50,0x800a);
    DrawBuffersIndexedBase::BlendMaskStateMachine::SetBlendFunc
              ((BlendMaskStateMachine *)local_50,0x8004,0x308);
    bVar1 = DrawBuffersIndexedBase::BlendMaskStateMachine::CheckAll
                      ((BlendMaskStateMachine *)local_50);
    if (bVar1) {
      DrawBuffersIndexedBase::BlendMaskStateMachine::SetDisablei
                ((BlendMaskStateMachine *)local_50,1);
      DrawBuffersIndexedBase::BlendMaskStateMachine::SetColorMaski
                ((BlendMaskStateMachine *)local_50,1,'\x01','\x01','\x01','\x01');
      DrawBuffersIndexedBase::BlendMaskStateMachine::SetBlendEquationi
                ((BlendMaskStateMachine *)local_50,1,0x8007);
      DrawBuffersIndexedBase::BlendMaskStateMachine::SetBlendFunci
                ((BlendMaskStateMachine *)local_50,1,0x307,0x8003);
      bVar1 = DrawBuffersIndexedBase::BlendMaskStateMachine::CheckAll
                        ((BlendMaskStateMachine *)local_50);
      if (bVar1) {
        DrawBuffersIndexedBase::BlendMaskStateMachine::SetBlendEquationSeparatei
                  ((BlendMaskStateMachine *)local_50,2,0x8008,0x8006);
        DrawBuffersIndexedBase::BlendMaskStateMachine::SetBlendFuncSeparatei
                  ((BlendMaskStateMachine *)local_50,2,0,1,0x300,0x306);
        bVar1 = DrawBuffersIndexedBase::BlendMaskStateMachine::CheckAll
                          ((BlendMaskStateMachine *)local_50);
        if (bVar1) {
          DrawBuffersIndexedBase::BlendMaskStateMachine::SetDefaults
                    ((BlendMaskStateMachine *)local_50);
          iVar2 = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
          if (iVar2 == 0) {
            tcu::TestContext::setTestResult
                      ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.
                       super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
          }
          else {
            tcu::TestContext::setTestResult
                      ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.
                       super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"Some functions generated error"
                      );
          }
        }
        else {
          tcu::TestContext::setTestResult
                    ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.
                     super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                     "Failed to change blending and color mask state");
        }
      }
      else {
        tcu::TestContext::setTestResult
                  ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.
                   super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                   "Failed to change blending and color mask state");
      }
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.
                 super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Failed to change blending and color mask state");
    }
    DrawBuffersIndexedBase::BlendMaskStateMachine::~BlendMaskStateMachine
              ((BlendMaskStateMachine *)local_50);
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult DrawBuffersIndexedSetGet::iterate()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	// Check number of available draw buffers
	glw::GLint maxDrawBuffers = 0;
	gl.getIntegerv(GL_MAX_DRAW_BUFFERS, &maxDrawBuffers);
	if (maxDrawBuffers < 4)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Minimum number of draw buffers too low");
		return STOP;
	}

	BlendMaskStateMachine state(m_context, m_testCtx.getLog(), maxDrawBuffers);

	state.SetEnable();
	state.SetColorMask(0, 0, 0, 0);
	state.SetBlendEquation(GL_FUNC_SUBTRACT);
	state.SetBlendFunc(GL_ONE_MINUS_CONSTANT_ALPHA, GL_SRC_ALPHA_SATURATE);
	if (!state.CheckAll())
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Failed to change blending and color mask state");
		return STOP;
	}

	state.SetDisablei(1);
	state.SetColorMaski(1, 1, 1, 1, 1);
	state.SetBlendEquationi(1, GL_MIN);
	state.SetBlendFunci(1, GL_ONE_MINUS_DST_COLOR, GL_CONSTANT_ALPHA);
	if (!state.CheckAll())
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Failed to change blending and color mask state");
		return STOP;
	}

	state.SetBlendEquationSeparatei(2, GL_MAX, GL_FUNC_ADD);
	state.SetBlendFuncSeparatei(2, GL_ZERO, GL_ONE, GL_SRC_COLOR, GL_DST_COLOR);
	if (!state.CheckAll())
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Failed to change blending and color mask state");
		return STOP;
	}

	state.SetDefaults();

	// Check for error
	glw::GLenum error_code = gl.getError();
	if (error_code != GL_NO_ERROR)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Some functions generated error");
		return STOP;
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}